

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O2

void __thiscall
Graph::insertEdge(Graph *this,int originID,int destinyID,int id,double resist,double react,bool swit
                 )

{
  Vertex *pVVar1;
  Vertex *pVVar2;
  Edge *this_00;
  
  pVVar1 = findVertex(this,originID);
  pVVar2 = findVertex(this,destinyID);
  this_00 = (Edge *)operator_new(0x60);
  Edge::Edge(this_00,id);
  this_00->destiny = pVVar2;
  this_00->origin = pVVar1;
  this_00->nextEdge = pVVar1->edgesList;
  pVVar1->edgesList = this_00;
  this_00->resistance = resist;
  this_00->reactance = react;
  this_00->closed = swit;
  pVVar1->outdegree = pVVar1->outdegree + 1;
  pVVar2->indegree = pVVar2->indegree + 1;
  this->edgesSize = this->edgesSize + 1;
  return;
}

Assistant:

void Graph::insertEdge(int originID, int destinyID, int id, double resist, double react, bool swit){
    Vertex *originVertex = findVertex(originID);
    Vertex *destinyVertex = findVertex(destinyID);
    Edge *newEdge = new Edge(id);
    newEdge->setDestiny(destinyVertex);
    newEdge->setOrigin(originVertex);

    // Insere Arco no inicio da lista
    newEdge->setNext(originVertex->getEdgesList());
    originVertex->setEdgesList(newEdge);
    newEdge->setResistance(resist);
    newEdge->setReactance(react);
    newEdge->setSwitch(swit);

    originVertex->setOutdegree(originVertex->getIndegree() + 1);
    destinyVertex->setIndegree(destinyVertex->getOutdegree() + 1);

    this->edgesSize++;
}